

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O2

int __thiscall
CVmObjIterIdx::getp_get_cur_val(CVmObjIterIdx *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  undefined4 in_register_00000034;
  
  if (getp_get_cur_val(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&getp_get_cur_val(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar3 != 0) {
      getp_get_cur_val::desc.min_argc_ = 0;
      getp_get_cur_val::desc.opt_argc_ = 0;
      getp_get_cur_val::desc.varargs_ = 0;
      __cxa_guard_release(&getp_get_cur_val(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_cur_val::desc);
  if (iVar3 == 0) {
    pcVar2 = (this->super_CVmObjIter).super_CVmObject.ext_;
    uVar1 = *(uint *)(pcVar2 + 5);
    if (((ulong)uVar1 == 0) || (*(uint *)(pcVar2 + 0xd) < uVar1)) {
      err_throw(0x7eb);
    }
    get_indexed_val(this,(ulong)uVar1,retval);
  }
  return 1;
}

Assistant:

int CVmObjIterIdx::getp_get_cur_val(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                    uint *argc)
{
    long idx;
    static CVmNativeCodeDesc desc(0);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the current index */
    idx = get_cur_index();

    /* if the current value is out of range, throw an error */
    if (idx < 1 || idx > get_last_valid())
        err_throw(VMERR_OUT_OF_RANGE);

    /* retrieve the value for this index */
    get_indexed_val(vmg_ idx, retval);

    /* handled */
    return TRUE;
}